

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::Continent::Continent(Continent *this,string *cname,int troops)

{
  string *this_00;
  int *piVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)cname);
  this->pCName = this_00;
  piVar1 = (int *)operator_new(4);
  *piVar1 = troops;
  this->pCTroops = piVar1;
  pvVar2 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pCountriesInContinent = pvVar2;
  return;
}

Assistant:

Map::Continent::Continent(std::string cname, int troops) {
    pCName = new std::string(std::move(cname));
    pCTroops = new int(troops);
    pCountriesInContinent = new std::vector<Country*>;
}